

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::NotifyNumConnectionsChanged(CConnman *this)

{
  uint newNumConnections;
  ulong uVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock65;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  uVar1 = (long)(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (uVar1 != this->nPrevNodeCount) {
    newNumConnections = (uint)uVar1;
    this->nPrevNodeCount = newNumConnections;
    if (this->m_client_interface != (CClientUIInterface *)0x0) {
      CClientUIInterface::NotifyNumConnectionsChanged(this->m_client_interface,newNumConnections);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::NotifyNumConnectionsChanged()
{
    size_t nodes_size;
    {
        LOCK(m_nodes_mutex);
        nodes_size = m_nodes.size();
    }
    if(nodes_size != nPrevNodeCount) {
        nPrevNodeCount = nodes_size;
        if (m_client_interface) {
            m_client_interface->NotifyNumConnectionsChanged(nodes_size);
        }
    }
}